

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::
RefBuilderSmall::attachBuildRefs
          (RefBuilderSmall *this,
          BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  atomic<unsigned_long> *paVar1;
  atomic<int> *paVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  BVH *pBVar8;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> this_01;
  BuildRef *pBVar9;
  MutexSys *pMVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  ThreadLocal2 *this_02;
  ulong uVar13;
  undefined4 *puVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  Geometry *geometry;
  long lVar20;
  undefined1 auVar21 [32];
  Lock<embree::MutexSys> lock;
  MutexSys *local_e8;
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *local_e0;
  mvector<PrimRef> local_d8;
  Lock<embree::MutexSys> local_b0;
  RefBuilderSmall *local_a0;
  long *local_98;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  local_90;
  PrimInfo pinfo;
  
  sVar19 = this->objectID_;
  pGVar7 = (topBuilder->scene->geometries).items[sVar19].ptr;
  geometry = (Geometry *)0x0;
  if ((pGVar7 != (Geometry *)0x0) && (*(char *)&pGVar7->field_8 == '\x18')) {
    geometry = pGVar7;
  }
  uVar5 = geometry->numPrimitives;
  uVar18 = (ulong)uVar5;
  lVar20 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_d8.alloc.device = (MemoryMonitorInterface *)(lVar20 + 0x550);
  if (lVar20 == 0) {
    local_d8.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_d8.items = (PrimRef *)0x0;
  local_d8.alloc.hugepages = false;
  local_d8.size_active = 0;
  local_d8.size_alloced = 0;
  local_a0 = this;
  if (uVar18 != 0) {
    sVar19 = uVar18 << 5;
    (**(local_d8.alloc.device)->_vptr_MemoryMonitorInterface)(local_d8.alloc.device,sVar19,0);
    if (uVar5 < 0xe0000) {
      local_d8.items = (PrimRef *)alignedMalloc(sVar19,0x20);
    }
    else {
      local_d8.items = (PrimRef *)os_malloc(sVar19,&local_d8.alloc.hugepages);
    }
    sVar19 = local_a0->objectID_;
    local_d8.size_alloced = uVar18;
  }
  local_d8.size_active = local_d8.size_alloced;
  avx::createPrimRefArray
            (&pinfo,geometry,(uint)sVar19,uVar18,&local_d8,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  lVar20 = 0x1c;
  local_98 = (long *)__tls_get_addr();
  uVar18 = 0;
  local_e0 = topBuilder;
  do {
    sVar19 = local_d8.size_alloced;
    if (pinfo.end - pinfo.begin <= uVar18) {
      if (local_d8.items != (PrimRef *)0x0) {
        if (local_d8.size_alloced << 5 < 0x1c00000) {
          alignedFree(local_d8.items);
        }
        else {
          os_free(local_d8.items,local_d8.size_alloced << 5,local_d8.alloc.hugepages);
        }
      }
      if (sVar19 != 0) {
        (**(local_d8.alloc.device)->_vptr_MemoryMonitorInterface)
                  (local_d8.alloc.device,sVar19 * -0x20,1);
      }
      return;
    }
    pBVar8 = local_e0->bvh;
    this_02 = (ThreadLocal2 *)*local_98;
    if (this_02 == (ThreadLocal2 *)0x0) {
      this_02 = (ThreadLocal2 *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys((MutexSys *)this_02);
      (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
      (this_02->alloc0).parent = this_02;
      auVar21 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_02->alloc0).ptr = (char *)auVar21._0_8_;
      (this_02->alloc0).cur = auVar21._8_8_;
      (this_02->alloc0).end = auVar21._16_8_;
      (this_02->alloc0).allocBlockSize = auVar21._24_8_;
      (this_02->alloc0).end = auVar21._0_8_;
      (this_02->alloc0).allocBlockSize = auVar21._8_8_;
      (this_02->alloc0).bytesUsed = auVar21._16_8_;
      (this_02->alloc0).bytesWasted = auVar21._24_8_;
      (this_02->alloc1).parent = this_02;
      auVar21 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_02->alloc1).ptr = (char *)auVar21._0_8_;
      (this_02->alloc1).cur = auVar21._8_8_;
      (this_02->alloc1).end = auVar21._16_8_;
      (this_02->alloc1).allocBlockSize = auVar21._24_8_;
      (this_02->alloc1).end = auVar21._0_8_;
      (this_02->alloc1).allocBlockSize = auVar21._8_8_;
      (this_02->alloc1).bytesUsed = auVar21._16_8_;
      (this_02->alloc1).bytesWasted = auVar21._24_8_;
      *local_98 = (long)this_02;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_b0.mutex = (MutexSys *)this_02;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&local_b0);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)&local_b0);
      Lock<embree::MutexSys>::~Lock(&lock);
    }
    this_00 = &pBVar8->alloc;
    uVar16 = (ulong)(((pBVar8->alloc).use_single_mode ^ 1) << 6);
    local_e8 = (MutexSys *)0x8;
    this_01._M_head_impl = *(ThreadLocal2 **)((long)&(this_02->alloc0).parent + uVar16);
    if (this_00 != ((this_01._M_head_impl)->alloc)._M_b._M_p) {
      local_b0.locked = true;
      local_b0.mutex = &(this_01._M_head_impl)->mutex;
      MutexSys::lock(&(this_01._M_head_impl)->mutex);
      if (((this_01._M_head_impl)->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &(((this_01._M_head_impl)->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             ((this_01._M_head_impl)->alloc1).bytesUsed + ((this_01._M_head_impl)->alloc0).bytesUsed
        ;
        UNLOCK();
        LOCK();
        paVar1 = &(((this_01._M_head_impl)->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             ((((this_01._M_head_impl)->alloc0).end + ((this_01._M_head_impl)->alloc1).end) -
             (((this_01._M_head_impl)->alloc0).cur + ((this_01._M_head_impl)->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &(((this_01._M_head_impl)->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             ((this_01._M_head_impl)->alloc1).bytesWasted +
             ((this_01._M_head_impl)->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar21 = ZEXT1632(ZEXT816(0) << 0x40);
      ((this_01._M_head_impl)->alloc0).end = auVar21._0_8_;
      ((this_01._M_head_impl)->alloc0).allocBlockSize = auVar21._8_8_;
      ((this_01._M_head_impl)->alloc0).bytesUsed = auVar21._16_8_;
      ((this_01._M_head_impl)->alloc0).bytesWasted = auVar21._24_8_;
      ((this_01._M_head_impl)->alloc0).ptr = (char *)auVar21._0_8_;
      ((this_01._M_head_impl)->alloc0).cur = auVar21._8_8_;
      ((this_01._M_head_impl)->alloc0).end = auVar21._16_8_;
      ((this_01._M_head_impl)->alloc0).allocBlockSize = auVar21._24_8_;
      ((this_01._M_head_impl)->alloc0).allocBlockSize = (pBVar8->alloc).defaultBlockSize;
      auVar21 = ZEXT1632(ZEXT816(0) << 0x40);
      ((this_01._M_head_impl)->alloc1).ptr = (char *)auVar21._0_8_;
      ((this_01._M_head_impl)->alloc1).cur = auVar21._8_8_;
      ((this_01._M_head_impl)->alloc1).end = auVar21._16_8_;
      ((this_01._M_head_impl)->alloc1).allocBlockSize = auVar21._24_8_;
      ((this_01._M_head_impl)->alloc1).end = auVar21._0_8_;
      ((this_01._M_head_impl)->alloc1).allocBlockSize = auVar21._8_8_;
      ((this_01._M_head_impl)->alloc1).bytesUsed = auVar21._16_8_;
      ((this_01._M_head_impl)->alloc1).bytesWasted = auVar21._24_8_;
      ((this_01._M_head_impl)->alloc1).allocBlockSize = (pBVar8->alloc).defaultBlockSize;
      LOCK();
      ((this_01._M_head_impl)->alloc)._M_b._M_p = this_00;
      UNLOCK();
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      local_90._M_t.
      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
           (tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            )(tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              )this_01._M_head_impl;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(pBVar8->alloc).thread_local_allocators,(value_type *)&local_90);
      Lock<embree::MutexSys>::~Lock(&lock);
      Lock<embree::MutexSys>::~Lock(&local_b0);
    }
    plVar3 = (long *)((long)&(this_02->alloc0).bytesUsed + uVar16);
    *plVar3 = (long)&local_e8->mutex + *plVar3;
    lVar15 = *(long *)((long)&(this_02->alloc0).cur + uVar16);
    uVar17 = (ulong)(-(int)lVar15 & 0xf);
    uVar13 = (long)&local_e8->mutex + uVar17 + lVar15;
    *(ulong *)((long)&(this_02->alloc0).cur + uVar16) = uVar13;
    if (*(ulong *)((long)&(this_02->alloc0).end + uVar16) < uVar13) {
      *(long *)((long)&(this_02->alloc0).cur + uVar16) = lVar15;
      pMVar10 = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar16);
      if (pMVar10 < (MutexSys *)((long)local_e8 << 2)) {
        puVar14 = (undefined4 *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      }
      else {
        lock.mutex = pMVar10;
        puVar14 = (undefined4 *)FastAllocator::malloc(this_00,(size_t)&lock);
        *(undefined4 **)((long)&(this_02->alloc0).ptr + uVar16) = puVar14;
        lVar15 = (*(long *)((long)&(this_02->alloc0).end + uVar16) -
                 *(long *)((long)&(this_02->alloc0).cur + uVar16)) +
                 *(long *)((long)&(this_02->alloc0).bytesWasted + uVar16);
        *(long *)((long)&(this_02->alloc0).bytesWasted + uVar16) = lVar15;
        *(undefined8 *)((long)&(this_02->alloc0).cur + uVar16) = 0;
        *(MutexSys **)((long)&(this_02->alloc0).end + uVar16) = lock.mutex;
        *(MutexSys **)((long)&(this_02->alloc0).cur + uVar16) = local_e8;
        if (lock.mutex < local_e8) {
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar16) = 0;
          lock.mutex = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar16);
          puVar14 = (undefined4 *)FastAllocator::malloc(this_00,(size_t)&lock);
          *(undefined4 **)((long)&(this_02->alloc0).ptr + uVar16) = puVar14;
          lVar15 = (*(long *)((long)&(this_02->alloc0).end + uVar16) -
                   *(long *)((long)&(this_02->alloc0).cur + uVar16)) +
                   *(long *)((long)&(this_02->alloc0).bytesWasted + uVar16);
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar16) = lVar15;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar16) = 0;
          *(MutexSys **)((long)&(this_02->alloc0).end + uVar16) = lock.mutex;
          *(MutexSys **)((long)&(this_02->alloc0).cur + uVar16) = local_e8;
          if (lock.mutex < local_e8) {
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar16) = 0;
            puVar14 = (undefined4 *)0x0;
            goto LAB_00dd4c6b;
          }
        }
        *(long *)((long)&(this_02->alloc0).bytesWasted + uVar16) = lVar15;
      }
    }
    else {
      plVar3 = (long *)((long)&(this_02->alloc0).bytesWasted + uVar16);
      *plVar3 = *plVar3 + uVar17;
      puVar14 = (undefined4 *)
                ((uVar13 - (long)local_e8) + *(long *)((long)&(this_02->alloc0).ptr + uVar16));
    }
LAB_00dd4c6b:
    uVar18 = uVar18 + 1;
    uVar6 = *(undefined4 *)((long)local_d8.items + lVar20 + -0x10);
    *puVar14 = *(undefined4 *)((long)&((local_d8.items)->lower).field_0 + lVar20);
    puVar14[1] = uVar6;
    aVar11 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                           field_0,ZEXT416((uint)local_a0->objectID_),0x30);
    LOCK();
    paVar2 = &local_e0->nextRef;
    iVar4 = (paVar2->super___atomic_base<int>)._M_i;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    aVar12 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                           field_0,ZEXT416(1),0x30);
    pBVar9 = (local_e0->refs).items;
    pBVar9[iVar4].super_PrimRef.upper.field_0 = aVar12;
    pBVar9[iVar4].super_PrimRef.lower.field_0 = aVar11;
    pBVar9[iVar4].node.ptr = (ulong)puVar14 | 9;
    pBVar9[iVar4].bounds_area = 0.0;
    lVar20 = lVar20 + 0x20;
  } while( true );
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }